

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adversarialunions_benchmark.c
# Opt level: O2

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __time_t _Var3;
  __syscall_slong_t _Var4;
  int iVar5;
  roaring_bitmap_t **pprVar6;
  roaring_bitmap_t *prVar7;
  roaring_bitmap_t *prVar8;
  roaring_bitmap_t *prVar9;
  size_t i_1;
  long lVar10;
  size_t i_2;
  size_t i;
  long lVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  timespec ts;
  
  puts("How to best aggregate the bitmaps is data-sensitive.");
  puts("The naive approach works well when the bitmaps quickly become full");
  pprVar6 = (roaring_bitmap_t **)malloc(800);
  for (lVar11 = 0; lVar11 != 100; lVar11 = lVar11 + 1) {
    prVar7 = roaring_bitmap_from_range(0,1000000,1);
    pprVar6[lVar11] = prVar7;
    lVar10 = 50000;
    while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
      iVar5 = rand();
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar5;
      roaring_bitmap_remove(prVar7,SUB164(auVar1 % ZEXT816(1000000),0));
    }
    roaring_bitmap_run_optimize(prVar7);
  }
  clock_gettime(3,(timespec *)&ts);
  _Var4 = ts.tv_nsec;
  _Var3 = ts.tv_sec;
  prVar7 = roaring_bitmap_or_many_heap(100,pprVar6);
  clock_gettime(3,(timespec *)&ts);
  lVar11 = (ts.tv_sec - _Var3) * 1000000000 + (ts.tv_nsec - _Var4);
  auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar13._0_8_ = lVar11;
  auVar13._12_4_ = 0x45300000;
  printf("%f cycles per union (many heap) \n",
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / 100.0);
  clock_gettime(3,(timespec *)&ts);
  _Var4 = ts.tv_nsec;
  _Var3 = ts.tv_sec;
  prVar8 = roaring_bitmap_or_many(100,pprVar6);
  clock_gettime(3,(timespec *)&ts);
  lVar11 = (ts.tv_sec - _Var3) * 1000000000 + (ts.tv_nsec - _Var4);
  auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar14._0_8_ = lVar11;
  auVar14._12_4_ = 0x45300000;
  printf("%f cycles per union (many) \n",
         ((auVar14._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / 100.0);
  clock_gettime(3,(timespec *)&ts);
  _Var4 = ts.tv_nsec;
  _Var3 = ts.tv_sec;
  prVar9 = roaring_bitmap_copy(*pprVar6);
  for (lVar11 = 1; lVar11 != 100; lVar11 = lVar11 + 1) {
    roaring_bitmap_or_inplace(prVar9,pprVar6[lVar11]);
  }
  clock_gettime(3,(timespec *)&ts);
  lVar11 = (ts.tv_sec - _Var3) * 1000000000 + (ts.tv_nsec - _Var4);
  auVar15._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar15._0_8_ = lVar11;
  auVar15._12_4_ = 0x45300000;
  printf("%f cycles per union (naive) \n",
         ((auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / 100.0);
  for (lVar11 = 0; lVar11 != 100; lVar11 = lVar11 + 1) {
    roaring_bitmap_free(pprVar6[lVar11]);
  }
  free(pprVar6);
  roaring_bitmap_free(prVar7);
  roaring_bitmap_free(prVar8);
  roaring_bitmap_free(prVar9);
  puts("The naive approach works less well when the bitmaps do not quickly become full");
  pprVar6 = (roaring_bitmap_t **)malloc(800);
  for (lVar11 = 0; lVar11 != 100; lVar11 = lVar11 + 1) {
    prVar7 = roaring_bitmap_from_range(0,1000000,100);
    pprVar6[lVar11] = prVar7;
    lVar10 = 50000;
    while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
      iVar5 = rand();
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)iVar5;
      roaring_bitmap_remove(prVar7,SUB164(auVar2 % ZEXT816(1000000),0));
    }
    roaring_bitmap_run_optimize(prVar7);
  }
  clock_gettime(3,(timespec *)&ts);
  _Var4 = ts.tv_nsec;
  _Var3 = ts.tv_sec;
  prVar7 = roaring_bitmap_or_many_heap(100,pprVar6);
  clock_gettime(3,(timespec *)&ts);
  lVar11 = (ts.tv_sec - _Var3) * 1000000000 + (ts.tv_nsec - _Var4);
  auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar16._0_8_ = lVar11;
  auVar16._12_4_ = 0x45300000;
  printf("%f cycles per union (many heap) \n",
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / 100.0);
  clock_gettime(3,(timespec *)&ts);
  _Var4 = ts.tv_nsec;
  _Var3 = ts.tv_sec;
  prVar8 = roaring_bitmap_or_many(100,pprVar6);
  clock_gettime(3,(timespec *)&ts);
  lVar11 = (ts.tv_sec - _Var3) * 1000000000 + (ts.tv_nsec - _Var4);
  auVar17._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar17._0_8_ = lVar11;
  auVar17._12_4_ = 0x45300000;
  printf("%f cycles per union (many) \n",
         ((auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / 100.0);
  clock_gettime(3,(timespec *)&ts);
  _Var4 = ts.tv_nsec;
  _Var3 = ts.tv_sec;
  prVar9 = roaring_bitmap_copy(*pprVar6);
  for (lVar11 = 1; lVar11 != 100; lVar11 = lVar11 + 1) {
    roaring_bitmap_or_inplace(prVar9,pprVar6[lVar11]);
  }
  clock_gettime(3,(timespec *)&ts);
  lVar11 = (ts.tv_sec - _Var3) * 1000000000 + (ts.tv_nsec - _Var4);
  auVar18._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar18._0_8_ = lVar11;
  auVar18._12_4_ = 0x45300000;
  printf("%f cycles per union (naive) \n",
         ((auVar18._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) / 100.0);
  for (lVar11 = 0; lVar11 != 100; lVar11 = lVar11 + 1) {
    roaring_bitmap_free(pprVar6[lVar11]);
  }
  free(pprVar6);
  roaring_bitmap_free(prVar7);
  roaring_bitmap_free(prVar8);
  roaring_bitmap_free(prVar9);
  return 0;
}

Assistant:

int main() {
    printf("How to best aggregate the bitmaps is data-sensitive.\n");
    quickfull();
    notsofull();
    return 0;
}